

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es32cRobustnessTests.cpp
# Opt level: O0

int __thiscall es32cts::RobustnessTests::init(RobustnessTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  RobustnessTests *this_local;
  
  tcu::TestNode::init((TestNode *)this,ctx);
  pTVar1 = (TestNode *)operator_new(0x80);
  ResetNotificationStrategy::NoResetNotificationCase::NoResetNotificationCase
            ((NoResetNotificationCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "noResetNotification","Verifies if NO_RESET_NOTIFICATION strategy works as expected.");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x80);
  ResetNotificationStrategy::LoseContextOnResetCase::LoseContextOnResetCase
            ((LoseContextOnResetCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "loseContextOnReset","Verifies if LOSE_CONTEXT_ON_RESET strategy works as expected.");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  RobustBufferAccessBehavior::GetnUniformTest::GetnUniformTest
            ((GetnUniformTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  RobustBufferAccessBehavior::ReadnPixelsTest::ReadnPixelsTest
            ((ReadnPixelsTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void RobustnessTests::init()
{
	deqp::TestCaseGroup::init();

	try
	{
		addChild(new ResetNotificationStrategy::NoResetNotificationCase(
			m_context, "noResetNotification", "Verifies if NO_RESET_NOTIFICATION strategy works as expected."));
		addChild(new ResetNotificationStrategy::LoseContextOnResetCase(
			m_context, "loseContextOnReset", "Verifies if LOSE_CONTEXT_ON_RESET strategy works as expected."));
		addChild(new RobustBufferAccessBehavior::GetnUniformTest(m_context));
		addChild(new RobustBufferAccessBehavior::ReadnPixelsTest(m_context));
	}
	catch (...)
	{
		// Destroy context.
		deqp::TestCaseGroup::deinit();
		throw;
	}
}